

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolj.c
# Opt level: O0

int ffpssjj(fitsfile *fptr,long group,long naxis,long *naxes,long *fpixel,long *lpixel,
           LONGLONG *array,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  LONGLONG local_200;
  long local_1f8;
  long irange [7];
  long local_1b8;
  long i7;
  long i6;
  long i5;
  long i4;
  long i3;
  long i2;
  long i1;
  long ii;
  LONGLONG st7;
  LONGLONG st6;
  LONGLONG st5;
  LONGLONG st4;
  LONGLONG st3;
  LONGLONG st2;
  LONGLONG st1;
  LONGLONG st70;
  LONGLONG st60;
  LONGLONG st50;
  LONGLONG st40;
  LONGLONG st30;
  LONGLONG st20;
  LONGLONG st10;
  LONGLONG off7;
  LONGLONG off6;
  LONGLONG off5;
  LONGLONG off4;
  LONGLONG off3;
  LONGLONG off2;
  LONGLONG pstart;
  LONGLONG astart;
  LONGLONG dimen [7];
  long local_88;
  LONGLONG fpix [7];
  long tablerow;
  long *lpixel_local;
  long *fpixel_local;
  long *naxes_local;
  long naxis_local;
  long group_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar1 = fits_is_compressed_image(fptr,status);
    if (iVar1 == 0) {
      if ((naxis < 1) || (7 < naxis)) {
        *status = 0x140;
        fptr_local._4_4_ = 0x140;
      }
      else {
        local_200 = group;
        if (group < 1) {
          local_200 = 1;
        }
        for (i1 = 0; i1 < 7; i1 = i1 + 1) {
          fpix[i1 + -1] = 1;
          irange[i1 + -1] = 1;
          dimen[i1 + -1] = 1;
        }
        for (i1 = 0; i1 < naxis; i1 = i1 + 1) {
          fpix[i1 + -1] = fpixel[i1];
          irange[i1 + -1] = (lpixel[i1] - fpixel[i1]) + 1;
          dimen[i1 + -1] = naxes[i1];
        }
        lVar2 = astart * dimen[0];
        lVar3 = lVar2 * dimen[1];
        lVar4 = lVar3 * dimen[2];
        lVar5 = lVar4 * dimen[3];
        ii = (fpix[5] + -1) * lVar5 * dimen[4];
        pstart = 0;
        for (local_1b8 = 0; local_1b8 < irange[5]; local_1b8 = local_1b8 + 1) {
          st7 = (fpix[4] + -1) * lVar5;
          for (i7 = 0; i7 < irange[4]; i7 = i7 + 1) {
            st6 = (fpix[3] + -1) * lVar4;
            for (i6 = 0; i6 < irange[3]; i6 = i6 + 1) {
              st5 = (fpix[2] + -1) * lVar3;
              for (i5 = 0; i5 < irange[2]; i5 = i5 + 1) {
                st4 = (fpix[1] + -1) * lVar2;
                for (i4 = 0; i4 < irange[1]; i4 = i4 + 1) {
                  off2 = local_88 + (fpix[0] + -1) * astart + st4 + st5 + st6 + st7 + ii;
                  for (i3 = 0; i3 < irange[0]; i3 = i3 + 1) {
                    iVar1 = ffpcljj(fptr,2,local_200,off2,local_1f8,array + pstart,status);
                    if (0 < iVar1) {
                      return *status;
                    }
                    pstart = local_1f8 + pstart;
                    off2 = astart + off2;
                  }
                  st4 = st4 + lVar2;
                }
                st5 = st5 + lVar3;
              }
              st6 = st6 + lVar4;
            }
            st7 = st7 + lVar5;
          }
          ii = ii + lVar5 * dimen[4];
        }
        fptr_local._4_4_ = *status;
      }
    }
    else {
      ffpmsg("writing TLONGLONG to compressed image is not supported");
      *status = 0x19d;
      fptr_local._4_4_ = 0x19d;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpssjj(fitsfile *fptr,  /* I - FITS file pointer                       */
           long  group,      /* I - group to write(1 = 1st group)           */
           long  naxis,      /* I - number of data axes in array            */
           long  *naxes,     /* I - size of each FITS axis                  */
           long  *fpixel,    /* I - 1st pixel in each axis to write (1=1st) */
           long  *lpixel,    /* I - last pixel in each axis to write        */
           LONGLONG *array,  /* I - array to be written                     */
           int  *status)     /* IO - error status                           */
/*
  Write a subsection of pixels to the primary array or image.
  A subsection is defined to be any contiguous rectangular
  array of pixels within the n-dimensional FITS data file.
  Data conversion and scaling will be performed if necessary 
  (e.g, if the datatype of the FITS array is not the same as
  the array being written).
*/
{
    long tablerow;
    LONGLONG fpix[7], dimen[7], astart, pstart;
    LONGLONG off2, off3, off4, off5, off6, off7;
    LONGLONG st10, st20, st30, st40, st50, st60, st70;
    LONGLONG st1, st2, st3, st4, st5, st6, st7;
    long ii, i1, i2, i3, i4, i5, i6, i7, irange[7];

    if (*status > 0)
        return(*status);

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing TLONGLONG to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    if (naxis < 1 || naxis > 7)
      return(*status = BAD_DIMEN);

    tablerow=maxvalue(1,group);

     /* calculate the size and number of loops to perform in each dimension */
    for (ii = 0; ii < 7; ii++)
    {
      fpix[ii]=1;
      irange[ii]=1;
      dimen[ii]=1;
    }

    for (ii = 0; ii < naxis; ii++)
    {    
      fpix[ii]=fpixel[ii];
      irange[ii]=lpixel[ii]-fpixel[ii]+1;
      dimen[ii]=naxes[ii];
    }

    i1=irange[0];

    /* compute the pixel offset between each dimension */
    off2 =     dimen[0];
    off3 = off2 * dimen[1];
    off4 = off3 * dimen[2];
    off5 = off4 * dimen[3];
    off6 = off5 * dimen[4];
    off7 = off6 * dimen[5];

    st10 = fpix[0];
    st20 = (fpix[1] - 1) * off2;
    st30 = (fpix[2] - 1) * off3;
    st40 = (fpix[3] - 1) * off4;
    st50 = (fpix[4] - 1) * off5;
    st60 = (fpix[5] - 1) * off6;
    st70 = (fpix[6] - 1) * off7;

    /* store the initial offset in each dimension */
    st1 = st10;
    st2 = st20;
    st3 = st30;
    st4 = st40;
    st5 = st50;
    st6 = st60;
    st7 = st70;

    astart = 0;

    for (i7 = 0; i7 < irange[6]; i7++)
    {
     for (i6 = 0; i6 < irange[5]; i6++)
     {
      for (i5 = 0; i5 < irange[4]; i5++)
      {
       for (i4 = 0; i4 < irange[3]; i4++)
       {
        for (i3 = 0; i3 < irange[2]; i3++)
        {
         pstart = st1 + st2 + st3 + st4 + st5 + st6 + st7;

         for (i2 = 0; i2 < irange[1]; i2++)
         {
           if (ffpcljj(fptr, 2, tablerow, pstart, i1, &array[astart],
              status) > 0)
              return(*status);

           astart += i1;
           pstart += off2;
         }
         st2 = st20;
         st3 = st3+off3;    
        }
        st3 = st30;
        st4 = st4+off4;
       }
       st4 = st40;
       st5 = st5+off5;
      }
      st5 = st50;
      st6 = st6+off6;
     }
     st6 = st60;
     st7 = st7+off7;
    }
    return(*status);
}